

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPlot.cpp
# Opt level: O1

bool __thiscall
SVGChart::PlotDataContainer::CalculateXRange(PlotDataContainer *this,float *outXMin,float *outXMax)

{
  PlotDataBase *this_00;
  bool bVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  long lVar5;
  pointer ppPVar6;
  float theXMax;
  float theXMin;
  float local_38;
  float local_34;
  
  *outXMin = 0.0;
  *outXMax = 0.0;
  ppPVar6 = (this->mXDataList).
            super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppPVar6 !=
      (this->mXDataList).
      super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar2 = true;
    do {
      this_00 = *ppPVar6;
      if (this_00 == (PlotDataBase *)0x0) {
        bVar1 = true;
      }
      else {
        lVar5 = PlotDataBase::GetSize(this_00);
        if (lVar5 == 0) {
          bVar1 = false;
        }
        else {
          iVar4 = (*this_00->_vptr_PlotDataBase[4])(this_00,&local_34,&local_38);
          bVar1 = true;
          if ((char)iVar4 != '\0') {
            if (local_34 <= local_38) {
              if (bVar2) {
                *outXMin = local_34;
                *outXMax = local_38;
                bVar2 = false;
              }
              if (*outXMax <= local_38 && local_38 != *outXMax) {
                *outXMax = local_38;
              }
              bVar1 = false;
              if (local_34 < *outXMin) {
                *outXMin = local_34;
              }
            }
          }
        }
      }
      if (bVar1) {
        bVar3 = 0;
        goto LAB_00104b55;
      }
      ppPVar6 = ppPVar6 + 1;
    } while (ppPVar6 !=
             (this->mXDataList).
             super__Vector_base<SVGChart::PlotDataBase_*,_std::allocator<SVGChart::PlotDataBase_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  bVar3 = -(*outXMin != 0.0 || *outXMax != 0.0);
LAB_00104b55:
  return (bool)(bVar3 & 1);
}

Assistant:

bool PlotDataContainer::CalculateXRange (float &outXMin, float &outXMax) const {
      bool theFirst = true;
      outXMin = 0;
      outXMax = 0;
      for (PlotDataList::const_iterator theI=mXDataList.begin();theI!=mXDataList.end ();theI++) {
        PlotDataBase *theXDataBase = *theI;
        if (!theXDataBase) {
          return false;
        }
        if (theXDataBase->GetSize () == 0) {
            continue;
        }
        float theXMin;
        float theXMax;
        if (!theXDataBase->CalculateRange (theXMin, theXMax)) {
          return false;
        }
        if (theXMax < theXMin) {
            return false;
        }
        if (theFirst) {
          outXMin = theXMin;
          outXMax = theXMax;
          theFirst = false;
        }
        if (theXMax>outXMax) {
          outXMax = theXMax;
        }
        if (theXMin<outXMin) {
          outXMin = theXMin;
        }
      }
      if (outXMin == 0 && outXMax == 0) {
          return false;
      }
      return true;
    }